

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_data.hpp
# Opt level: O3

void __thiscall
duckdb::ArrowAppendData::ArrowAppendData(ArrowAppendData *this,ClientProperties *options_p)

{
  pointer pcVar1;
  ClientContext *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  
  switchD_00569a20::default(this,0,0xa8);
  (this->options).time_zone._M_dataplus._M_p = (pointer)&(this->options).time_zone.field_2;
  pcVar1 = (options_p->time_zone)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->options,pcVar1,pcVar1 + (options_p->time_zone)._M_string_length);
  bVar3 = options_p->arrow_use_list_view;
  bVar4 = options_p->produce_arrow_string_view;
  bVar5 = options_p->arrow_lossless_conversion;
  uVar6 = *(undefined4 *)&options_p->field_0x24;
  pCVar2 = (options_p->client_context).ptr;
  (this->options).arrow_offset_size = options_p->arrow_offset_size;
  (this->options).arrow_use_list_view = bVar3;
  (this->options).produce_arrow_string_view = bVar4;
  (this->options).arrow_lossless_conversion = bVar5;
  *(undefined4 *)&(this->options).field_0x24 = uVar6;
  (this->options).client_context.ptr = pCVar2;
  (this->dictionary).release = (_func_void_ArrowArray_ptr *)0x0;
  this->offset = 0;
  (this->arrow_buffers).super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>.
  super__Vector_base<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arrow_buffers).super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>.
  super__Vector_base<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arrow_buffers).super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>.
  super__Vector_base<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>::resize
            (&(this->arrow_buffers).
              super_vector<duckdb::ArrowBuffer,_std::allocator<duckdb::ArrowBuffer>_>,3);
  return;
}

Assistant:

explicit ArrowAppendData(const ClientProperties &options_p) : options(options_p) {
		dictionary.release = nullptr;
		arrow_buffers.resize(3);
	}